

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lstrlib.c
# Opt level: O3

int str_find_aux(lua_State *L,int find)

{
  char *__s1;
  char cVar1;
  int iVar2;
  char *pcVar3;
  char *pcVar4;
  long lVar5;
  char *pcVar6;
  size_t sVar7;
  ulong uVar8;
  long lVar9;
  char *pcVar10;
  ulong uVar11;
  char *__s2;
  size_t lp;
  size_t ls;
  MatchState ms;
  ulong local_278;
  size_t local_270;
  char *local_268;
  ulong local_260;
  MatchState local_258;
  
  pcVar3 = luaL_checklstring(L,1,&local_260);
  pcVar4 = luaL_checklstring(L,2,&local_278);
  lVar5 = luaL_optinteger(L,3,1);
  lVar9 = 1;
  if (lVar5 < 0) {
    if ((ulong)-lVar5 <= local_260) {
      lVar5 = lVar5 + local_260 + 1;
      goto LAB_0012c2f5;
    }
  }
  else {
LAB_0012c2f5:
    if ((0 < lVar5) && (lVar9 = lVar5, (long)(local_260 + 1) < lVar5)) goto LAB_0012c496;
  }
  local_270 = CONCAT44(local_270._4_4_,find);
  uVar8 = local_278;
  if (find == 0) {
LAB_0012c41c:
    cVar1 = *pcVar4;
    if (cVar1 == '^') {
      pcVar4 = pcVar4 + 1;
      uVar8 = uVar8 - 1;
      local_278 = uVar8;
    }
    local_258.matchdepth = 200;
    local_258.src_end = pcVar3 + local_260;
    local_258.p_end = pcVar4 + uVar8;
    local_258.src_init = pcVar3;
    local_258.L = L;
    do {
      lVar5 = lVar9 + -1;
      local_258.level = '\0';
      pcVar10 = match(&local_258,pcVar3 + lVar5,pcVar4);
      if (pcVar10 != (char *)0x0) {
        if ((int)local_270 != 0) {
          lua_pushinteger(L,lVar9);
          lua_pushinteger(L,(long)pcVar10 - (long)pcVar3);
          iVar2 = push_captures(&local_258,(char *)0x0,(char *)0x0);
          return iVar2 + 2;
        }
        iVar2 = push_captures(&local_258,pcVar3 + lVar9 + -1,pcVar10);
        return iVar2;
      }
    } while ((cVar1 != '^') && (lVar9 = lVar9 + 1, pcVar3 + lVar5 < local_258.src_end));
  }
  else {
    local_268 = pcVar4;
    iVar2 = lua_toboolean(L,4);
    uVar8 = local_278;
    if (iVar2 == 0) {
      uVar11 = 0;
      do {
        pcVar10 = local_268 + uVar11;
        pcVar6 = strpbrk(pcVar10,"^$*+?.([%-");
        pcVar4 = local_268;
        if (pcVar6 != (char *)0x0) goto LAB_0012c41c;
        sVar7 = strlen(pcVar10);
        uVar11 = uVar11 + sVar7 + 1;
      } while (uVar11 <= uVar8);
    }
    pcVar4 = pcVar3 + lVar9 + -1;
    if (uVar8 == 0) {
LAB_0012c503:
      lua_pushinteger(L,(lua_Integer)(pcVar4 + (1 - (long)pcVar3)));
      lua_pushinteger(L,(lua_Integer)(pcVar4 + (local_278 - (long)pcVar3)));
      return 2;
    }
    uVar11 = (local_260 - lVar9) + 1;
    if (uVar8 <= uVar11) {
      local_270 = uVar8 - 1;
      pcVar10 = (char *)(uVar11 - local_270);
      if (pcVar10 != (char *)0x0) {
        cVar1 = *local_268;
        __s2 = local_268 + 1;
        pcVar6 = pcVar4;
        do {
          pcVar4 = (char *)memchr(pcVar6,(int)cVar1,(size_t)pcVar10);
          if (pcVar4 == (char *)0x0) break;
          __s1 = pcVar4 + 1;
          iVar2 = bcmp(__s1,__s2,local_270);
          if (iVar2 == 0) goto LAB_0012c503;
          pcVar10 = pcVar6 + ((long)pcVar10 - (long)__s1);
          pcVar6 = __s1;
        } while (pcVar10 != (char *)0x0);
      }
    }
  }
LAB_0012c496:
  lua_pushnil(L);
  return 1;
}

Assistant:

static int str_find_aux (lua_State *L, int find) {
  size_t ls, lp;
  const char *s = luaL_checklstring(L, 1, &ls);
  const char *p = luaL_checklstring(L, 2, &lp);
  size_t init = posrelatI(luaL_optinteger(L, 3, 1), ls) - 1;
  if (init > ls) {  /* start after string's end? */
    luaL_pushfail(L);  /* cannot find anything */
    return 1;
  }
  /* explicit request or no special characters? */
  if (find && (lua_toboolean(L, 4) || nospecials(p, lp))) {
    /* do a plain search */
    const char *s2 = lmemfind(s + init, ls - init, p, lp);
    if (s2) {
      lua_pushinteger(L, (s2 - s) + 1);
      lua_pushinteger(L, (s2 - s) + lp);
      return 2;
    }
  }
  else {
    MatchState ms;
    const char *s1 = s + init;
    int anchor = (*p == '^');
    if (anchor) {
      p++; lp--;  /* skip anchor character */
    }
    prepstate(&ms, L, s, ls, p, lp);
    do {
      const char *res;
      reprepstate(&ms);
      if ((res=match(&ms, s1, p)) != NULL) {
        if (find) {
          lua_pushinteger(L, (s1 - s) + 1);  /* start */
          lua_pushinteger(L, res - s);   /* end */
          return push_captures(&ms, NULL, 0) + 2;
        }
        else
          return push_captures(&ms, s1, res);
      }
    } while (s1++ < ms.src_end && !anchor);
  }
  luaL_pushfail(L);  /* not found */
  return 1;
}